

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall parser::Parser::popOperator(Parser *this,bool isBinary)

{
  size_type sVar1;
  reference ppEVar2;
  reference pvVar3;
  Expr *local_40;
  value_type local_38;
  value_type e2_1;
  value_type local_28;
  value_type e1;
  value_type e2;
  Parser *pPStack_10;
  bool isBinary_local;
  Parser *this_local;
  
  e2._7_1_ = isBinary;
  pPStack_10 = this;
  sVar1 = std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::size
                    (&this->Operands);
  if ((sVar1 < 2) || ((e2._7_1_ & 1) == 0)) {
    sVar1 = std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::size
                      (&this->Operands);
    if (sVar1 != 0) {
      ppEVar2 = std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::top
                          (&this->Operands);
      local_38 = *ppEVar2;
      std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::pop
                (&this->Operands);
      pvVar3 = std::
               stack<std::pair<int,_Operator>,_std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>_>
               ::top(&this->Operators);
      local_40 = mkNode(this,&pvVar3->second,(Expr *)0x0,local_38);
      std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::push
                (&this->Operands,&local_40);
    }
  }
  else {
    ppEVar2 = std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::top
                        (&this->Operands);
    e1 = *ppEVar2;
    std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::pop
              (&this->Operands);
    ppEVar2 = std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::top
                        (&this->Operands);
    local_28 = *ppEVar2;
    std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::pop
              (&this->Operands);
    pvVar3 = std::
             stack<std::pair<int,_Operator>,_std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>_>
             ::top(&this->Operators);
    e2_1 = mkNode(this,&pvVar3->second,local_28,e1);
    std::stack<ast::Expr_*,_std::deque<ast::Expr_*,_std::allocator<ast::Expr_*>_>_>::push
              (&this->Operands,&e2_1);
  }
  std::
  stack<std::pair<int,_Operator>,_std::deque<std::pair<int,_Operator>,_std::allocator<std::pair<int,_Operator>_>_>_>
  ::pop(&this->Operators);
  return;
}

Assistant:

void Parser::popOperator(bool isBinary)
{

    if(Operands.size() >= 2 && isBinary)
    {
      auto e2 = Operands.top();
      Operands.pop();
      auto e1 = Operands.top();
      Operands.pop();
      Operands.push(mkNode(Operators.top().second, e1, e2));
    }else if(Operands.size() > 0){
        auto e2 = Operands.top();
        Operands.pop();
        Operands.push(mkNode(Operators.top().second, nullptr, e2));
    }
    Operators.pop();
}